

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFont * __thiscall ImFontAtlas::AddFont(ImFontAtlas *this,ImFontConfig *font_cfg)

{
  ImFont **__src;
  ImFontConfig *__src_00;
  int iVar1;
  ImFont *this_00;
  ImFont **__dest;
  ImFontConfig *pIVar2;
  void *__dest_00;
  int iVar3;
  int iVar4;
  
  if (font_cfg->MergeMode == false) {
    this_00 = (ImFont *)ImGui::MemAlloc(0x70);
    ImFont::ImFont(this_00);
    iVar1 = (this->Fonts).Size;
    if (iVar1 == (this->Fonts).Capacity) {
      if (iVar1 == 0) {
        iVar3 = 8;
      }
      else {
        iVar3 = iVar1 / 2 + iVar1;
      }
      iVar4 = iVar1 + 1;
      if (iVar1 + 1 < iVar3) {
        iVar4 = iVar3;
      }
      __dest = (ImFont **)ImGui::MemAlloc((long)iVar4 << 3);
      __src = (this->Fonts).Data;
      if (__src != (ImFont **)0x0) {
        memcpy(__dest,__src,(long)(this->Fonts).Size << 3);
        ImGui::MemFree((this->Fonts).Data);
      }
      (this->Fonts).Data = __dest;
      (this->Fonts).Capacity = iVar4;
      iVar1 = (this->Fonts).Size;
    }
    else {
      __dest = (this->Fonts).Data;
    }
    __dest[iVar1] = this_00;
    (this->Fonts).Size = (this->Fonts).Size + 1;
  }
  iVar1 = (this->ConfigData).Size;
  if (iVar1 == (this->ConfigData).Capacity) {
    if (iVar1 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar1 / 2 + iVar1;
    }
    iVar4 = iVar1 + 1;
    if (iVar1 + 1 < iVar3) {
      iVar4 = iVar3;
    }
    pIVar2 = (ImFontConfig *)ImGui::MemAlloc((long)iVar4 * 0x88);
    __src_00 = (this->ConfigData).Data;
    if (__src_00 != (ImFontConfig *)0x0) {
      memcpy(pIVar2,__src_00,(long)(this->ConfigData).Size * 0x88);
      ImGui::MemFree((this->ConfigData).Data);
    }
    (this->ConfigData).Data = pIVar2;
    (this->ConfigData).Capacity = iVar4;
    iVar1 = (this->ConfigData).Size;
  }
  else {
    pIVar2 = (this->ConfigData).Data;
  }
  memcpy(pIVar2 + iVar1,font_cfg,0x88);
  iVar1 = (this->ConfigData).Size;
  (this->ConfigData).Size = iVar1 + 1;
  pIVar2 = (this->ConfigData).Data;
  if (pIVar2[iVar1].DstFont == (ImFont *)0x0) {
    pIVar2[iVar1].DstFont = (this->Fonts).Data[(long)(this->Fonts).Size + -1];
  }
  if (pIVar2[iVar1].FontDataOwnedByAtlas == false) {
    __dest_00 = ImGui::MemAlloc((long)pIVar2[iVar1].FontDataSize);
    pIVar2[iVar1].FontData = __dest_00;
    pIVar2[iVar1].FontDataOwnedByAtlas = true;
    memcpy(__dest_00,font_cfg->FontData,(long)pIVar2[iVar1].FontDataSize);
  }
  ClearTexData(this);
  return pIVar2[iVar1].DstFont;
}

Assistant:

ImFont* ImFontAtlas::AddFont(const ImFontConfig* font_cfg)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    IM_ASSERT(font_cfg->FontData != NULL && font_cfg->FontDataSize > 0);
    IM_ASSERT(font_cfg->SizePixels > 0.0f);

    // Create new font
    if (!font_cfg->MergeMode)
        Fonts.push_back(IM_NEW(ImFont));
    else
        IM_ASSERT(!Fonts.empty() && "Cannot use MergeMode for the first font"); // When using MergeMode make sure that a font has already been added before. You can use ImGui::GetIO().Fonts->AddFontDefault() to add the default imgui font.

    ConfigData.push_back(*font_cfg);
    ImFontConfig& new_font_cfg = ConfigData.back();
    if (new_font_cfg.DstFont == NULL)
        new_font_cfg.DstFont = Fonts.back();
    if (!new_font_cfg.FontDataOwnedByAtlas)
    {
        new_font_cfg.FontData = ImGui::MemAlloc(new_font_cfg.FontDataSize);
        new_font_cfg.FontDataOwnedByAtlas = true;
        memcpy(new_font_cfg.FontData, font_cfg->FontData, (size_t)new_font_cfg.FontDataSize);
    }

    // Invalidate texture
    ClearTexData();
    return new_font_cfg.DstFont;
}